

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Node * __thiscall rw::ColorQuant::createNode(ColorQuant *this,int32 level)

{
  Node *pNVar1;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 1117"
  ;
  pNVar1 = (Node *)(*DAT_00149de8)(0xb0);
  memset(&pNVar1->parent,0,0x88);
  (pNVar1->link).next = (LLLink *)0x0;
  (pNVar1->link).prev = (LLLink *)0x0;
  pNVar1->r = 0;
  pNVar1->g = 0;
  pNVar1->b = 0;
  pNVar1->a = 0;
  pNVar1->numPixels = 0;
  if (level == 0) {
    (pNVar1->link).next = &(this->leaves).link;
    (pNVar1->link).prev = (this->leaves).link.prev;
    ((this->leaves).link.prev)->next = &pNVar1->link;
    (this->leaves).link.prev = &pNVar1->link;
  }
  return pNVar1;
}

Assistant:

ColorQuant::Node*
ColorQuant::createNode(int32 level)
{
	int i;
	ColorQuant::Node *node = rwNewT(ColorQuant::Node, 1, MEMDUR_EVENT | ID_IMAGE);
	node->parent = nil;
	for(i = 0; i < 16; i++)
		node->children[i] = nil;
	node->r = 0;
	node->g = 0;
	node->b = 0;
	node->a = 0;
	node->numPixels = 0;
	node->link.init();

	if(level == 0)
		this->leaves.append(&node->link);

	return node;
}